

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteName(WatWriter *this,string_view str,NextChar next_char)

{
  byte *pbVar1;
  size_type *src;
  _Alloc_hider size;
  byte bVar2;
  byte *pbVar3;
  ulong size_00;
  byte *pbVar4;
  ulong uVar5;
  byte *src_00;
  long lVar6;
  size_type *local_60;
  string valid_str;
  
  size_00 = str.size_;
  src_00 = (byte *)str.data_;
  if ((size_00 == 0) || (*src_00 != 0x24)) {
    __assert_fail("!str.empty() && str.front() == \'$\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/wat-writer.cc"
                  ,0x14f,
                  "void wabt::(anonymous namespace)::WatWriter::WriteName(string_view, NextChar)");
  }
  pbVar1 = src_00 + size_00;
  pbVar3 = src_00;
  if (0 < (long)size_00 >> 2) {
    pbVar3 = src_00 + (size_00 & 0xfffffffffffffffc);
    lVar6 = ((long)size_00 >> 2) + 1;
    pbVar4 = src_00 + 3;
    do {
      if ((anonymous_namespace)::s_valid_name_chars[pbVar4[-3]] == '\0') {
        pbVar4 = pbVar4 + -3;
        goto LAB_00f7c517;
      }
      if ((anonymous_namespace)::s_valid_name_chars[pbVar4[-2]] == '\0') {
        pbVar4 = pbVar4 + -2;
        goto LAB_00f7c517;
      }
      if ((anonymous_namespace)::s_valid_name_chars[pbVar4[-1]] == '\0') {
        pbVar4 = pbVar4 + -1;
        goto LAB_00f7c517;
      }
      if ((anonymous_namespace)::s_valid_name_chars[*pbVar4] == '\0') goto LAB_00f7c517;
      lVar6 = lVar6 + -1;
      pbVar4 = pbVar4 + 4;
    } while (1 < lVar6);
  }
  lVar6 = (long)pbVar1 - (long)pbVar3;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      pbVar4 = pbVar1;
      if ((lVar6 != 3) ||
         (pbVar4 = pbVar3, (anonymous_namespace)::s_valid_name_chars[*pbVar3] == '\0'))
      goto LAB_00f7c517;
      pbVar3 = pbVar3 + 1;
    }
    pbVar4 = pbVar3;
    if ((anonymous_namespace)::s_valid_name_chars[*pbVar3] == '\0') goto LAB_00f7c517;
    pbVar3 = pbVar3 + 1;
  }
  pbVar4 = pbVar3;
  if ((anonymous_namespace)::s_valid_name_chars[*pbVar3] != '\0') {
    pbVar4 = pbVar1;
  }
LAB_00f7c517:
  if (pbVar4 == pbVar1) {
    WriteNextChar(this);
    Stream::WriteData(this->stream_,src_00,size_00,(char *)0x0,No);
  }
  else {
    local_60 = &valid_str._M_string_length;
    valid_str._M_dataplus._M_p = (pointer)0x0;
    valid_str._M_string_length._0_1_ = 0;
    uVar5 = 0;
    valid_str.field_2._8_8_ = this;
    do {
      bVar2 = 0x5f;
      if ((anonymous_namespace)::s_valid_name_chars[src_00[uVar5]] != '\0') {
        bVar2 = src_00[uVar5];
      }
      std::__cxx11::string::push_back((string *)&local_60,bVar2);
      this = (WatWriter *)valid_str.field_2._8_8_;
      size = valid_str._M_dataplus;
      src = local_60;
      uVar5 = uVar5 + 1;
    } while (size_00 != uVar5);
    WriteNextChar((WatWriter *)valid_str.field_2._8_8_);
    Stream::WriteData(*(Stream **)((long)this + 0x18),src,(size_t)size._M_p,(char *)0x0,No);
    if (local_60 != &valid_str._M_string_length) {
      operator_delete(local_60);
    }
  }
  this->next_char_ = next_char;
  return;
}

Assistant:

void WatWriter::WriteName(string_view str, NextChar next_char) {
  // Debug names must begin with a $ for for wast file to be valid
  assert(!str.empty() && str.front() == '$');
  bool has_invalid_chars = std::any_of(
      str.begin(), str.end(), [](uint8_t c) { return !s_valid_name_chars[c]; });

  if (has_invalid_chars) {
    std::string valid_str;
    std::transform(str.begin(), str.end(), std::back_inserter(valid_str),
                   [](uint8_t c) { return s_valid_name_chars[c] ? c : '_'; });
    WriteDataWithNextChar(valid_str.data(), valid_str.length());
  } else {
    WriteDataWithNextChar(str.data(), str.length());
  }

  next_char_ = next_char;
}